

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
absl::lts_20250127::Mul32(lts_20250127 *this,pair<unsigned_long,_unsigned_long> num,uint32_t mul)

{
  byte bVar1;
  unsigned_long local_80;
  uint64_t hi;
  uint64_t lo;
  unsigned_long uStack_68;
  uint shift;
  uint64_t bits128_up;
  uint64_t bits64_127;
  uint64_t bits0_63;
  uint64_t bits96_127;
  uint64_t bits64_95;
  uint64_t bits32_63;
  uint64_t bits0_31;
  lts_20250127 *plStack_28;
  uint32_t mul_local;
  pair<unsigned_long,_unsigned_long> num_local;
  
  num_local.first = num.first;
  bits0_31._4_4_ = (uint)num.second;
  bits32_63 = (ulong)bits0_31._4_4_ * (num_local.first & 0xffffffff);
  bits64_95 = (ulong)bits0_31._4_4_ * (num_local.first >> 0x20);
  bits96_127 = (ulong)bits0_31._4_4_ * ((ulong)this & 0xffffffff);
  bits0_63 = (ulong)bits0_31._4_4_ * ((ulong)this >> 0x20);
  bits64_127 = bits32_63 + (bits64_95 << 0x20);
  bits128_up = bits96_127 + (bits0_63 << 0x20) + (bits64_95 >> 0x20) +
               (ulong)(bits64_127 < bits32_63);
  uStack_68 = (bits0_63 >> 0x20) + (ulong)(bits128_up < bits96_127);
  plStack_28 = this;
  if (uStack_68 == 0) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&num_local.second,&bits128_up,&bits64_127);
  }
  else {
    lo._4_4_ = bit_width<unsigned_long>(uStack_68);
    bVar1 = (byte)lo._4_4_;
    hi = (bits64_127 >> (bVar1 & 0x3f)) + (bits128_up << (0x40 - bVar1 & 0x3f));
    local_80 = (bits128_up >> (bVar1 & 0x3f)) + (uStack_68 << (0x40 - bVar1 & 0x3f));
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&num_local.second,&local_80,&hi);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static std::pair<uint64_t, uint64_t> Mul32(std::pair<uint64_t, uint64_t> num,
                                           uint32_t mul) {
  uint64_t bits0_31 = num.second & 0xFFFFFFFF;
  uint64_t bits32_63 = num.second >> 32;
  uint64_t bits64_95 = num.first & 0xFFFFFFFF;
  uint64_t bits96_127 = num.first >> 32;

  // The picture so far: each of these 64-bit values has only the lower 32 bits
  // filled in.
  // bits96_127:          [ 00000000 xxxxxxxx ]
  // bits64_95:                    [ 00000000 xxxxxxxx ]
  // bits32_63:                             [ 00000000 xxxxxxxx ]
  // bits0_31:                                       [ 00000000 xxxxxxxx ]

  bits0_31 *= mul;
  bits32_63 *= mul;
  bits64_95 *= mul;
  bits96_127 *= mul;

  // Now the top halves may also have value, though all 64 of their bits will
  // never be set at the same time, since they are a result of a 32x32 bit
  // multiply.  This makes the carry calculation slightly easier.
  // bits96_127:          [ mmmmmmmm | mmmmmmmm ]
  // bits64_95:                    [ | mmmmmmmm mmmmmmmm | ]
  // bits32_63:                      |        [ mmmmmmmm | mmmmmmmm ]
  // bits0_31:                       |                 [ | mmmmmmmm mmmmmmmm ]
  // eventually:        [ bits128_up | ...bits64_127.... | ..bits0_63... ]

  uint64_t bits0_63 = bits0_31 + (bits32_63 << 32);
  uint64_t bits64_127 = bits64_95 + (bits96_127 << 32) + (bits32_63 >> 32) +
                        (bits0_63 < bits0_31);
  uint64_t bits128_up = (bits96_127 >> 32) + (bits64_127 < bits64_95);
  if (bits128_up == 0) return {bits64_127, bits0_63};

  auto shift = static_cast<unsigned>(bit_width(bits128_up));
  uint64_t lo = (bits0_63 >> shift) + (bits64_127 << (64 - shift));
  uint64_t hi = (bits64_127 >> shift) + (bits128_up << (64 - shift));
  return {hi, lo};
}